

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledInputFile::setFrameBuffer(TiledInputFile *this,FrameBuffer *frameBuffer)

{
  Data *pDVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  undefined6 uVar5;
  PixelType PVar6;
  PixelType PVar7;
  pointer pTVar8;
  TiledInputFile *pTVar9;
  int iVar10;
  TInSliceInfo *__cur;
  ChannelList *this_00;
  const_iterator cVar11;
  ConstIterator CVar12;
  ConstIterator CVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  pointer pTVar16;
  ostream *poVar17;
  char *pcVar18;
  ArgExc *this_01;
  pointer pTVar19;
  size_t __n;
  ulong __n_00;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  *__x;
  bool bVar20;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  slices;
  stringstream _iex_throw_s;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  local_1e8;
  pthread_mutex_t *local_1d0;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  *local_1c8;
  TiledInputFile *local_1c0;
  undefined1 local_1b8 [16];
  ostream oStack_1a8;
  undefined7 uStack_1a7;
  undefined1 uStack_1a0;
  undefined7 uStack_19f;
  bool bStack_198;
  bool local_197;
  _Base_ptr local_190;
  ulong uStack_188;
  
  local_1d0 = (pthread_mutex_t *)this->_data->_streamData;
  iVar10 = pthread_mutex_lock(local_1d0);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  this_00 = Header::channels(&this->_data->header);
  cVar11._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  while( true ) {
    CVar12 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar11._M_node == CVar12._i._M_node) break;
    CVar13 = ChannelList::find(this_00,(char *)(cVar11._M_node + 1));
    cVar14._M_node = (_Base_ptr)ChannelList::end(this_00);
    if ((CVar13._i._M_node != (const_iterator)cVar14._M_node) &&
       ((*(_Rb_tree_color *)((long)CVar13._i._M_node + 0x124) != cVar11._M_node[10]._M_color ||
        (*(int *)((long)CVar13._i._M_node + 0x128) != *(int *)&cVar11._M_node[10].field_0x4)))) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&oStack_1a8,"X and/or y subsampling factors of \"",0x23);
      poVar17 = std::operator<<(&oStack_1a8,(char *)((long)CVar13._i._M_node + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel of input file \"",0x19)
      ;
      pcVar18 = IStream::fileName(this->_data->_streamData->is);
      poVar17 = std::operator<<(poVar17,pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17,"\" are not compatible with the frame buffer\'s subsampling factors.",0x41)
      ;
      this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this_01,(stringstream *)local_1b8);
      __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
  }
  local_1e8.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar14._M_node = (_Base_ptr)ChannelList::begin(this_00);
  local_1c8 = (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)frameBuffer;
  cVar11._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  local_1c0 = this;
  do {
    CVar12 = FrameBuffer::end((FrameBuffer *)local_1c8);
    __x = local_1c8;
    if ((const_iterator)cVar11._M_node == CVar12._i._M_node) {
      while( true ) {
        CVar13 = ChannelList::end(this_00);
        pTVar9 = local_1c0;
        if ((const_iterator)cVar14._M_node == CVar13._i._M_node) break;
        local_1b8._0_4_ = cVar14._M_node[9]._M_color;
        uStack_1a0 = 0;
        uStack_19f = 0;
        bStack_198 = false;
        local_1b8._8_8_ = (_Base_ptr)0x0;
        oStack_1a8 = (ostream)0x0;
        uStack_1a7 = 0;
        local_197 = true;
        local_190 = (_Base_ptr)0x0;
        uStack_188 = 0;
        local_1b8._4_4_ = local_1b8._0_4_;
        std::
        vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ::push_back(&local_1e8,(value_type *)local_1b8);
        cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&local_1c0->_data->frameBuffer,__x);
      pTVar8 = local_1e8.
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pTVar19 = local_1e8.
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar1 = pTVar9->_data;
      __n_00 = (long)local_1e8.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pTVar16 = (pDVar1->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar1->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar16) < __n_00
         ) {
        pTVar16 = std::
                  _Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                  ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                                 *)(((long)__n_00 >> 3) * 0x6db6db6db6db6db7),(size_t)__x);
        if (pTVar19 != pTVar8) {
          memcpy(pTVar16,pTVar19,((__n_00 - 0x38) / 0x38) * 0x38 + 0x38);
        }
        pTVar19 = (pDVar1->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pTVar19 != (pointer)0x0) {
          operator_delete(pTVar19,(long)(pDVar1->slices).
                                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pTVar19);
        }
        (pDVar1->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar16;
        (pDVar1->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pTVar16 + __n_00);
      }
      else {
        pTVar19 = (pDVar1->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)pTVar19 - (long)pTVar16;
        if (__n < __n_00) {
          if (pTVar19 != pTVar16) {
            memmove(pTVar16,local_1e8.
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,__n);
          }
          pTVar16 = (pDVar1->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pTVar19 = (pointer)(((long)pTVar16 -
                                   (long)(pDVar1->slices).
                                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start) +
                                  (long)local_1e8.
                                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              pTVar19 !=
              local_1e8.
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish; pTVar19 = pTVar19 + 1) {
            iVar10 = pTVar19->yTileCoords;
            pTVar16->xTileCoords = pTVar19->xTileCoords;
            pTVar16->yTileCoords = iVar10;
            PVar6 = pTVar19->typeInFrameBuffer;
            PVar7 = pTVar19->typeInFile;
            pcVar18 = pTVar19->base;
            sVar2 = pTVar19->xStride;
            sVar3 = pTVar19->yStride;
            bVar20 = pTVar19->skip;
            uVar5 = *(undefined6 *)&pTVar19->field_0x22;
            dVar4 = pTVar19->fillValue;
            pTVar16->fill = pTVar19->fill;
            pTVar16->skip = bVar20;
            *(undefined6 *)&pTVar16->field_0x22 = uVar5;
            pTVar16->fillValue = dVar4;
            pTVar16->xStride = sVar2;
            pTVar16->yStride = sVar3;
            pTVar16->typeInFrameBuffer = PVar6;
            pTVar16->typeInFile = PVar7;
            pTVar16->base = pcVar18;
            pTVar16 = pTVar16 + 1;
          }
        }
        else if (local_1e8.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 local_1e8.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          memmove(pTVar16,local_1e8.
                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n_00);
        }
      }
      (pDVar1->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(__n_00 + (long)(pDVar1->slices).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      if (local_1e8.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e8.
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pthread_mutex_unlock(local_1d0);
      return;
    }
    while( true ) {
      CVar13 = ChannelList::end(this_00);
      if ((const_iterator)cVar14._M_node == CVar13._i._M_node) break;
      iVar10 = strcmp((char *)(cVar14._M_node + 1),(char *)(cVar11._M_node + 1));
      if (-1 < iVar10) break;
      local_1b8._0_4_ = cVar14._M_node[9]._M_color;
      uStack_1a0 = 0;
      uStack_19f = 0;
      bStack_198 = false;
      local_1b8._8_8_ = (_Base_ptr)0x0;
      oStack_1a8 = (ostream)0x0;
      uStack_1a7 = 0;
      local_197 = true;
      local_190 = (_Base_ptr)0x0;
      uStack_188 = 0;
      local_1b8._4_4_ = local_1b8._0_4_;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ::push_back(&local_1e8,(value_type *)local_1b8);
      cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
    }
    CVar13 = ChannelList::end(this_00);
    if ((const_iterator)cVar14._M_node == CVar13._i._M_node) {
LAB_005939df:
      bVar20 = true;
    }
    else {
      iVar10 = strcmp((char *)(cVar14._M_node + 1),(char *)(cVar11._M_node + 1));
      if (0 < iVar10) goto LAB_005939df;
      bVar20 = false;
    }
    cVar15._M_node = cVar14._M_node;
    if (bVar20 != false) {
      cVar15._M_node = cVar11._M_node;
    }
    local_1b8._0_4_ = cVar11._M_node[9]._M_color;
    local_1b8._4_4_ = cVar15._M_node[9]._M_color;
    local_1b8._8_8_ = cVar11._M_node[9]._M_parent;
    local_190 = cVar11._M_node[10]._M_parent;
    oStack_1a8 = SUB81(cVar11._M_node[9]._M_left,0);
    uStack_1a7 = (undefined7)((ulong)cVar11._M_node[9]._M_left >> 8);
    uStack_1a0 = SUB81(cVar11._M_node[9]._M_right,0);
    uStack_19f = (undefined7)((ulong)cVar11._M_node[9]._M_right >> 8);
    local_197 = false;
    uStack_188 = (ulong)CONCAT14(*(undefined1 *)((long)&cVar11._M_node[10]._M_left + 1),
                                 (uint)*(byte *)&cVar11._M_node[10]._M_left);
    bStack_198 = bVar20;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
    ::push_back(&local_1e8,(value_type *)local_1b8);
    CVar13 = ChannelList::end(this_00);
    if (bVar20 == false && (const_iterator)cVar14._M_node != CVar13._i._M_node) {
      cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
    }
    cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
  } while( true );
}

Assistant:

void	
TiledInputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Set the frame buffer
    //

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
				"of \"" << i.name() << "\" channel "
				"of input file \"" << fileName() << "\" are "
				"not compatible with the frame buffer's "
				"subsampling factors.");
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<TInSliceInfo> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (TInSliceInfo (i.channel().type,
					    i.channel().type,
					    0,      // base
					    0,      // xStride
					    0,      // yStride
					    false,  // fill
					    true,   // skip
					    0.0));  // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (TInSliceInfo (j.slice().type,
                                        fill? j.slice().type: i.channel().type,
                                        j.slice().base,
                                        j.slice().xStride,
                                        j.slice().yStride,
                                        fill,
                                        false, // skip
                                        j.slice().fillValue,
                                        (j.slice().xTileCoords)? 1: 0,
                                        (j.slice().yTileCoords)? 1: 0));

        if (i != channels.end() && !fill)
            ++i;
    }

    while (i != channels.end())
    {
	//
	// Channel i is present in the file but not
	// in the frame buffer; data for channel i
	// will be skipped during readPixels().
	//

	slices.push_back (TInSliceInfo (i.channel().type,
					i.channel().type,
					0, // base
					0, // xStride
					0, // yStride
					false,  // fill
					true, // skip
					0.0)); // fillValue
	++i;
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}